

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void PreVisitWith(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  ArenaAllocator *alloc;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  ushort uVar1;
  Scope *innerScope;
  Type *ppFVar2;
  ParseNodeWith *pPVar3;
  FuncInfo *pFVar4;
  
  alloc = byteCodeGenerator->alloc;
  pFVar4 = (FuncInfo *)0x0;
  innerScope = (Scope *)new<Memory::ArenaAllocator>(0x48,alloc,0x364470);
  innerScope->enclosingScope = (Scope *)0x0;
  innerScope->scopeInfo = (ScopeInfo *)0x0;
  innerScope->location = 0xffffffff;
  innerScope->func = (FuncInfo *)0x0;
  innerScope->m_symList = (Symbol *)0x0;
  innerScope->m_count = 0;
  innerScope->alloc = alloc;
  innerScope->scopeSlotCount = 0;
  innerScope->innerScopeIndex = 0xffffffff;
  innerScope->scopeType = ScopeType_With;
  uVar1 = (ushort)*(undefined4 *)&innerScope->field_0x44 & 0xf000 | 0x84;
  *(ushort *)&innerScope->field_0x44 = uVar1;
  this = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != this) {
    ppFVar2 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar4 = *ppFVar2;
    uVar1 = *(ushort *)&innerScope->field_0x44;
  }
  innerScope->func = pFVar4;
  *(ushort *)&innerScope->field_0x44 = uVar1 | 1;
  pPVar3 = ParseNode::AsParseNodeWith(pnode);
  pPVar3->scope = innerScope;
  ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
  return;
}

Assistant:

void PreVisitWith(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    Scope *scope = Anew(alloc, Scope, alloc, ScopeType_With);
    scope->SetFunc(byteCodeGenerator->TopFuncInfo());
    scope->SetIsDynamic(true);
    pnode->AsParseNodeWith()->scope = scope;

    byteCodeGenerator->PushScope(scope);
}